

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::expectSilentCastPossible
               (Context *context,ArrayView<soul::Type> targetTypes,Expression *source)

{
  bool bVar1;
  uint uVar2;
  Type *type;
  Type *other;
  Type *this;
  undefined1 alwaysParenthesise;
  undefined8 in_R8;
  Type *__end2;
  int iVar3;
  bool bVar4;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> types_00;
  Type sourceType;
  string local_f8;
  string local_d8;
  Type local_b8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  types.s = targetTypes.e;
  this = targetTypes.s;
  (*(source->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_b8,source);
  alwaysParenthesise = (undefined1)in_R8;
  bVar4 = this == types.s;
  if (bVar4) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    other = this;
    do {
      bVar1 = Type::isEqual(&local_b8,other,4);
      if (!bVar1) {
        uVar2 = (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(source,other);
        iVar3 = iVar3 + (uVar2 & 0xff);
      }
      alwaysParenthesise = (undefined1)in_R8;
      if (bVar1) break;
      other = other + 1;
      bVar4 = other == types.s;
    } while (!bVar4);
  }
  if (bVar4) {
    if (iVar3 == 0) {
      Type::getDescription_abi_cxx11_(&local_d8,&local_b8);
      types.e = (Type *)0x0;
      heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
                (&local_f8,(Utilities *)this,types,(bool)alwaysParenthesise);
      CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                (&local_68,(CompileMessageHelpers *)0x1,none,0x2ac388,(char *)&local_d8,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context);
      AST::Context::throwError(context,&local_68,false);
    }
    if (1 < iVar3) {
      Type::getDescription_abi_cxx11_(&local_d8,&local_b8);
      types_00.e = (Type *)0x0;
      types_00.s = types.s;
      heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
                (&local_f8,(Utilities *)this,types_00,(bool)alwaysParenthesise);
      CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                (&local_a0,(CompileMessageHelpers *)0x1,none,0x2ad766,(char *)&local_d8,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context);
      AST::Context::throwError(context,&local_a0,false);
    }
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
  return;
}

Assistant:

static void expectSilentCastPossible (const AST::Context& context, ArrayView<Type> targetTypes, AST::Expression& source)
    {
        auto sourceType = source.getResultType();

        int matches = 0;

        for (auto& type : targetTypes)
        {
            // If we have an exact match, it doesn't matter how many other types could be used silently
            if (sourceType.isEqual (type, Type::ignoreVectorSize1))
                return;

            if (source.canSilentlyCastTo (type))
                ++matches;
        }

        if (matches == 0)
            context.throwError (Errors::cannotImplicitlyCastType (sourceType.getDescription(),
                                                                  heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));

        if (matches > 1)
            context.throwError (Errors::ambiguousCastBetween (sourceType.getDescription(),
                                                              heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));
    }